

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O1

void __thiscall fdtd_solver::advance_e(fdtd_solver *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  uint uVar11;
  int iVar12;
  field3d<celle> *pfVar13;
  cellb **ppcVar14;
  cellb *pcVar15;
  cellb *pcVar16;
  cellj *pcVar17;
  celle *pcVar18;
  cellb ***pppcVar19;
  field3d<cellb> *pfVar20;
  field3d<cellj> *pfVar21;
  cellb **ppcVar22;
  cellj **ppcVar23;
  celle **ppcVar24;
  byte bVar25;
  bool bVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM26 [64];
  undefined1 in_ZMM27 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar61 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  
  pfVar13 = (this->super_maxwell_solver).ce;
  iVar10 = pfVar13->nx;
  uVar11 = pfVar13->ny;
  iVar12 = pfVar13->nz;
  uVar31 = (ulong)(iVar10 - 1);
  if (2 < iVar10) {
    auVar40 = vpbroadcastq_avx512f();
    uVar33 = 1;
    auVar41 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar43 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar44 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      if (2 < (int)uVar11) {
        auVar35._8_8_ = 0;
        auVar35._0_8_ = (this->super_maxwell_solver).dtdz;
        auVar45 = vbroadcastsd_avx512f(auVar35);
        auVar82._0_8_ = auVar45._0_8_ ^ 0x8000000000000000;
        auVar82._8_8_ = auVar45._8_8_ ^ 0x8000000000000000;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = (this->super_maxwell_solver).dtdx;
        auVar46 = vbroadcastsd_avx512f(auVar36);
        auVar83._0_8_ = auVar46._0_8_ ^ 0x8000000000000000;
        auVar83._8_8_ = auVar46._8_8_ ^ 0x8000000000000000;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (this->super_maxwell_solver).dtdy;
        auVar47 = vbroadcastsd_avx512f(auVar1);
        auVar84._0_8_ = auVar47._0_8_ ^ 0x8000000000000000;
        auVar84._8_8_ = auVar47._8_8_ ^ 0x8000000000000000;
        auVar48 = vbroadcastsd_avx512f(auVar82);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (this->super_maxwell_solver).dx;
        auVar49 = vbroadcastsd_avx512f(auVar2);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (this->super_maxwell_solver).dy;
        auVar50 = vbroadcastsd_avx512f(auVar3);
        auVar51 = vbroadcastsd_avx512f(auVar83);
        auVar52 = vbroadcastsd_avx512f(auVar84);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (this->super_maxwell_solver).dz;
        auVar53 = vbroadcastsd_avx512f(auVar4);
        uVar34 = 1;
        do {
          if (2 < iVar12) {
            ppcVar14 = (((this->super_maxwell_solver).cb)->p)._M_t.
                       super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                       super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                       super__Head_base<0UL,_cellb_***,_false>._M_head_impl[uVar33];
            pcVar15 = ppcVar14[uVar34 - 1];
            pcVar16 = ppcVar14[uVar34];
            pcVar17 = (((this->super_maxwell_solver).cj)->p)._M_t.
                      super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                      super__Head_base<0UL,_cellj_***,_false>._M_head_impl[uVar33][uVar34];
            pcVar18 = (pfVar13->p)._M_t.
                      super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                      super__Head_base<0UL,_celle_***,_false>._M_head_impl[uVar33][uVar34];
            auVar54 = vpbroadcastq_avx512f();
            auVar55 = vpbroadcastq_avx512f();
            auVar56 = vpbroadcastq_avx512f();
            auVar57 = vpbroadcastq_avx512f();
            uVar32 = 0;
            auVar58 = vmovdqa64_avx512f(auVar41);
            do {
              auVar59 = vpbroadcastq_avx512f();
              auVar59 = vporq_avx512f(auVar59,auVar42);
              uVar27 = vpcmpuq_avx512f(auVar59,auVar40,2);
              auVar59 = vpmullq_avx512dq(auVar58,auVar43);
              auVar60 = vpaddq_avx512f(auVar54,auVar59);
              auVar35 = vxorpd_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
              auVar61 = vgatherqpd_avx512f(pcVar16->bz);
              bVar25 = (byte)uVar27;
              auVar62._0_8_ =
                   (ulong)(bVar25 & 1) * auVar61._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar35._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              auVar62._8_8_ = (ulong)bVar26 * auVar61._8_8_ | (ulong)!bVar26 * auVar35._8_8_;
              auVar62._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar61._16_8_;
              auVar62._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar61._24_8_;
              auVar62._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar61._32_8_;
              auVar62._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar61._40_8_;
              auVar62._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar61._48_8_;
              auVar62._56_8_ = (uVar27 >> 7) * auVar61._56_8_;
              auVar35 = vxorpd_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
              auVar36 = vxorpd_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
              auVar61 = vgatherqpd_avx512f(pcVar15->bz);
              auVar63._0_8_ =
                   (ulong)(bVar25 & 1) * auVar61._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar35._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              auVar63._8_8_ = (ulong)bVar26 * auVar61._8_8_ | (ulong)!bVar26 * auVar35._8_8_;
              auVar63._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar61._16_8_;
              auVar63._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar61._24_8_;
              auVar63._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar61._32_8_;
              auVar63._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar61._40_8_;
              auVar63._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar61._48_8_;
              auVar63._56_8_ = (uVar27 >> 7) * auVar61._56_8_;
              auVar61 = vgatherqpd_avx512f(pcVar16->by);
              in_ZMM24._0_8_ =
                   (ulong)(bVar25 & 1) * auVar61._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar36._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              in_ZMM24._8_8_ = (ulong)bVar26 * auVar61._8_8_ | (ulong)!bVar26 * auVar36._8_8_;
              in_ZMM24._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar61._16_8_;
              in_ZMM24._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar61._24_8_;
              in_ZMM24._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar61._32_8_;
              in_ZMM24._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar61._40_8_;
              in_ZMM24._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar61._48_8_;
              in_ZMM24._56_8_ = (uVar27 >> 7) * auVar61._56_8_;
              auVar35 = vxorpd_avx512vl(auVar60._0_16_,auVar60._0_16_);
              auVar61 = vgatherqpd_avx512f(pcVar16[-1].by);
              auVar60._0_8_ =
                   (ulong)(bVar25 & 1) * auVar61._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar35._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              auVar60._8_8_ = (ulong)bVar26 * auVar61._8_8_ | (ulong)!bVar26 * auVar35._8_8_;
              auVar60._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar61._16_8_;
              auVar60._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar61._24_8_;
              auVar60._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar61._32_8_;
              auVar60._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar61._40_8_;
              auVar60._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar61._48_8_;
              auVar60._56_8_ = (uVar27 >> 7) * auVar61._56_8_;
              auVar60 = vsubpd_avx512f(in_ZMM24,auVar60);
              auVar61 = vsubpd_avx512f(auVar62,auVar63);
              auVar60 = vmulpd_avx512f(auVar60,auVar48);
              auVar60 = vfmadd231pd_avx512f(auVar60,auVar47,auVar61);
              auVar35 = vxorpd_avx512vl(auVar61._0_16_,auVar61._0_16_);
              auVar61 = vgatherqpd_avx512f(pcVar17->jx);
              auVar64._0_8_ =
                   (ulong)(bVar25 & 1) * auVar61._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar35._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              auVar64._8_8_ = (ulong)bVar26 * auVar61._8_8_ | (ulong)!bVar26 * auVar35._8_8_;
              auVar64._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar61._16_8_;
              auVar64._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar61._24_8_;
              auVar64._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar61._32_8_;
              auVar64._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar61._40_8_;
              auVar64._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar61._48_8_;
              auVar64._56_8_ = (uVar27 >> 7) * auVar61._56_8_;
              vpaddq_avx512f(auVar55,auVar59);
              auVar61 = vfnmadd213pd_avx512f(auVar64,auVar49,auVar60);
              auVar35 = vxorpd_avx512vl(auVar60._0_16_,auVar60._0_16_);
              auVar60 = vgatherqpd_avx512f(pcVar18->ex);
              auVar65._0_8_ =
                   (ulong)(bVar25 & 1) * auVar60._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar35._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              auVar65._8_8_ = (ulong)bVar26 * auVar60._8_8_ | (ulong)!bVar26 * auVar35._8_8_;
              auVar65._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar60._16_8_;
              auVar65._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar60._24_8_;
              auVar65._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar60._32_8_;
              auVar65._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar60._40_8_;
              auVar65._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar60._48_8_;
              auVar65._56_8_ = (uVar27 >> 7) * auVar60._56_8_;
              auVar60 = vaddpd_avx512f(auVar61,auVar65);
              in_ZMM23 = vpaddq_avx512f(auVar56,auVar59);
              vscatterqpd_avx512f(ZEXT864(pcVar18) + auVar43,uVar27,auVar60);
              vpaddq_avx512f(auVar57,auVar59);
              auVar35 = vxorpd_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
              auVar60 = vgatherqpd_avx512f(pcVar16->bz);
              auVar59._0_8_ =
                   (ulong)(bVar25 & 1) * auVar60._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar35._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              auVar59._8_8_ = (ulong)bVar26 * auVar60._8_8_ | (ulong)!bVar26 * auVar35._8_8_;
              auVar59._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar60._16_8_;
              auVar59._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar60._24_8_;
              auVar59._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar60._32_8_;
              auVar59._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar60._40_8_;
              auVar59._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar60._48_8_;
              auVar59._56_8_ = (uVar27 >> 7) * auVar60._56_8_;
              auVar35 = vxorpd_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
              auVar60 = vgatherqpd_avx512f(pcVar16->bx);
              in_ZMM27._0_8_ =
                   (ulong)(bVar25 & 1) * auVar60._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar35._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              in_ZMM27._8_8_ = (ulong)bVar26 * auVar60._8_8_ | (ulong)!bVar26 * auVar35._8_8_;
              in_ZMM27._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar60._16_8_;
              in_ZMM27._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar60._24_8_;
              in_ZMM27._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar60._32_8_;
              in_ZMM27._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar60._40_8_;
              in_ZMM27._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar60._48_8_;
              in_ZMM27._56_8_ = (uVar27 >> 7) * auVar60._56_8_;
              auVar35 = vxorpd_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
              auVar59 = vsubpd_avx512f(auVar62,auVar59);
              auVar60 = vgatherqpd_avx512f(pcVar16[-1].bx);
              auVar37._0_8_ =
                   (ulong)(bVar25 & 1) * auVar60._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar35._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              auVar37._8_8_ = (ulong)bVar26 * auVar60._8_8_ | (ulong)!bVar26 * auVar35._8_8_;
              auVar61._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar60._16_8_;
              auVar61._0_16_ = auVar37;
              auVar61._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar60._24_8_;
              auVar61._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar60._32_8_;
              auVar61._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar60._40_8_;
              auVar61._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar60._48_8_;
              auVar61._56_8_ = (uVar27 >> 7) * auVar60._56_8_;
              auVar60 = vsubpd_avx512f(in_ZMM27,auVar61);
              auVar60 = vmulpd_avx512f(auVar45,auVar60);
              auVar35 = vxorpd_avx512vl(auVar37,auVar37);
              in_ZMM26 = vfmadd231pd_avx512f(auVar60,auVar51,auVar59);
              auVar60 = vgatherqpd_avx512f(pcVar17->jy);
              auVar66._0_8_ =
                   (ulong)(bVar25 & 1) * auVar60._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar35._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              auVar66._8_8_ = (ulong)bVar26 * auVar60._8_8_ | (ulong)!bVar26 * auVar35._8_8_;
              auVar66._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar60._16_8_;
              auVar66._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar60._24_8_;
              auVar66._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar60._32_8_;
              auVar66._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar60._40_8_;
              auVar66._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar60._48_8_;
              auVar66._56_8_ = (uVar27 >> 7) * auVar60._56_8_;
              in_ZMM28 = vfnmadd213pd_avx512f(auVar66,auVar50,in_ZMM26);
              auVar35 = vxorpd_avx512vl(auVar59._0_16_,auVar59._0_16_);
              auVar59 = vgatherqpd_avx512f(*(undefined8 *)((ulong)uVar11 + 8));
              auVar67._0_8_ =
                   (ulong)(bVar25 & 1) * auVar59._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar35._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              auVar67._8_8_ = (ulong)bVar26 * auVar59._8_8_ | (ulong)!bVar26 * auVar35._8_8_;
              auVar67._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar59._16_8_;
              auVar67._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar59._24_8_;
              auVar67._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar59._32_8_;
              auVar67._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar59._40_8_;
              auVar67._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar59._48_8_;
              auVar67._56_8_ = (uVar27 >> 7) * auVar59._56_8_;
              auVar59 = vaddpd_avx512f(auVar67,in_ZMM28);
              vscatterqpd_avx512f(ZEXT864(8) + auVar46,uVar27,auVar59);
              auVar35 = vxorpd_avx512vl(auVar59._0_16_,auVar59._0_16_);
              auVar59 = vgatherqpd_avx512f(pcVar16->by);
              auVar38._0_8_ =
                   (ulong)(bVar25 & 1) * auVar59._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar35._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              auVar38._8_8_ = (ulong)bVar26 * auVar59._8_8_ | (ulong)!bVar26 * auVar35._8_8_;
              auVar68._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar59._16_8_;
              auVar68._0_16_ = auVar38;
              auVar68._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar59._24_8_;
              auVar68._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar59._32_8_;
              auVar68._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar59._40_8_;
              auVar68._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar59._48_8_;
              auVar68._56_8_ = (uVar27 >> 7) * auVar59._56_8_;
              auVar59 = vsubpd_avx512f(in_ZMM24,auVar68);
              auVar35 = vxorpd_avx512vl(auVar38,auVar38);
              auVar60 = vgatherqpd_avx512f(pcVar15->bx);
              auVar39._0_8_ =
                   (ulong)(bVar25 & 1) * auVar60._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar35._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              auVar39._8_8_ = (ulong)bVar26 * auVar60._8_8_ | (ulong)!bVar26 * auVar35._8_8_;
              auVar69._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar60._16_8_;
              auVar69._0_16_ = auVar39;
              auVar69._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar60._24_8_;
              auVar69._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar60._32_8_;
              auVar69._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar60._40_8_;
              auVar69._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar60._48_8_;
              auVar69._56_8_ = (uVar27 >> 7) * auVar60._56_8_;
              auVar60 = vsubpd_avx512f(in_ZMM27,auVar69);
              auVar60 = vmulpd_avx512f(auVar60,auVar52);
              auVar60 = vfmadd231pd_avx512f(auVar60,auVar46,auVar59);
              auVar35 = vxorpd_avx512vl(auVar59._0_16_,auVar59._0_16_);
              auVar59 = vgatherqpd_avx512f(pcVar17->jz);
              auVar70._0_8_ =
                   (ulong)(bVar25 & 1) * auVar59._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar35._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              auVar70._8_8_ = (ulong)bVar26 * auVar59._8_8_ | (ulong)!bVar26 * auVar35._8_8_;
              auVar70._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar59._16_8_;
              auVar70._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar59._24_8_;
              auVar70._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar59._32_8_;
              auVar70._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar59._40_8_;
              auVar70._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar59._48_8_;
              auVar70._56_8_ = (uVar27 >> 7) * auVar59._56_8_;
              auVar35 = vxorpd_avx512vl(auVar39,auVar39);
              auVar59 = vfnmadd213pd_avx512f(auVar70,auVar53,auVar60);
              auVar60 = vgatherqpd_avx512f(*(undefined8 *)((ulong)uVar11 + 0x10));
              in_ZMM22._0_8_ =
                   (ulong)(bVar25 & 1) * auVar60._0_8_ | (ulong)!(bool)(bVar25 & 1) * auVar35._0_8_;
              bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
              in_ZMM22._8_8_ = (ulong)bVar26 * auVar60._8_8_ | (ulong)!bVar26 * auVar35._8_8_;
              in_ZMM22._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar60._16_8_;
              in_ZMM22._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar60._24_8_;
              in_ZMM22._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar60._32_8_;
              in_ZMM22._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar60._40_8_;
              in_ZMM22._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar60._48_8_;
              in_ZMM22._56_8_ = (uVar27 >> 7) * auVar60._56_8_;
              auVar59 = vaddpd_avx512f(in_ZMM22,auVar59);
              vscatterqpd_avx512f(ZEXT864(0x10) + auVar46,uVar27,auVar59);
              uVar32 = uVar32 + 8;
              auVar58 = vpaddq_avx512f(auVar58,auVar44);
            } while (((ulong)(iVar12 - 1) + 6 & 0x1fffffff8) != uVar32);
          }
          uVar34 = uVar34 + 1;
        } while (uVar34 != uVar11 - 1);
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar31);
  }
  uVar33 = (ulong)(uVar11 - 1);
  if (2 < (int)uVar11) {
    auVar75._8_8_ = 0;
    auVar75._0_8_ = (this->super_maxwell_solver).dtdz;
    auVar28._8_8_ = 0x8000000000000000;
    auVar28._0_8_ = 0x8000000000000000;
    auVar35 = vxorpd_avx512vl(auVar75,auVar28);
    auVar40 = vpbroadcastq_avx512f();
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this->super_maxwell_solver).dtdy;
    auVar41 = vbroadcastsd_avx512f(auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (this->super_maxwell_solver).dx;
    auVar42 = vbroadcastsd_avx512f(auVar6);
    auVar43 = vbroadcastsd_avx512f(auVar35);
    uVar34 = 1;
    auVar44 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar45 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar46 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar47 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      if (2 < iVar12) {
        ppcVar14 = *(((this->super_maxwell_solver).cb)->p)._M_t.
                    super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                    super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
        pcVar18 = (*(pfVar13->p)._M_t.
                    super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                    super__Head_base<0UL,_celle_***,_false>._M_head_impl)[uVar34];
        auVar48 = vpbroadcastq_avx512f();
        uVar32 = 0;
        auVar49 = vmovdqa64_avx512f(auVar44);
        do {
          auVar50 = vpbroadcastq_avx512f();
          auVar50 = vporq_avx512f(auVar50,auVar45);
          uVar27 = vpcmpuq_avx512f(auVar50,auVar40,2);
          auVar50 = vpmullq_avx512dq(auVar49,auVar46);
          vpaddq_avx512f(auVar48,auVar50);
          auVar51 = vgatherqpd_avx512f(*(undefined8 *)(uVar34 + 0x10));
          bVar25 = (byte)uVar27;
          auVar52._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar51._8_8_;
          auVar52._0_8_ = (ulong)(bVar25 & 1) * auVar51._0_8_;
          auVar52._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar51._16_8_;
          auVar52._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar51._24_8_;
          auVar52._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar51._32_8_;
          auVar52._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar51._40_8_;
          auVar52._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar51._48_8_;
          auVar52._56_8_ = (uVar27 >> 7) * auVar51._56_8_;
          auVar53 = vgatherqpd_avx512f(*(undefined8 *)((long)&ppcVar14[uVar34 - 1]->bz + uVar33));
          auVar51._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar53._8_8_;
          auVar51._0_8_ = (ulong)(bVar25 & 1) * auVar53._0_8_;
          auVar51._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar53._16_8_;
          auVar51._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar53._24_8_;
          auVar51._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar53._32_8_;
          auVar51._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar53._40_8_;
          auVar51._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar53._48_8_;
          auVar51._56_8_ = (uVar27 >> 7) * auVar53._56_8_;
          auVar51 = vsubpd_avx512f(auVar52,auVar51);
          auVar52 = vgatherqpd_avx512f(*(undefined8 *)(uVar34 + 8));
          auVar53._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar52._8_8_;
          auVar53._0_8_ = (ulong)(bVar25 & 1) * auVar52._0_8_;
          auVar53._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar52._16_8_;
          auVar53._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar52._24_8_;
          auVar53._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar52._32_8_;
          auVar53._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar52._40_8_;
          auVar53._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar52._48_8_;
          auVar53._56_8_ = (uVar27 >> 7) * auVar52._56_8_;
          auVar52 = vgatherqpd_avx512f(*(undefined8 *)((long)ppcVar14[uVar34] + (uVar33 - 0x10)));
          auVar54._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar52._8_8_;
          auVar54._0_8_ = (ulong)(bVar25 & 1) * auVar52._0_8_;
          auVar54._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar52._16_8_;
          auVar54._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar52._24_8_;
          auVar54._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar52._32_8_;
          auVar54._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar52._40_8_;
          auVar54._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar52._48_8_;
          auVar54._56_8_ = (uVar27 >> 7) * auVar52._56_8_;
          auVar52 = vsubpd_avx512f(auVar53,auVar54);
          auVar52 = vmulpd_avx512f(auVar52,auVar43);
          auVar51 = vfmadd231pd_avx512f(auVar52,auVar41,auVar51);
          auVar52 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&(*(((this->super_maxwell_solver).cj)->p)._M_t.
                                                  super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>
                                                  .super__Head_base<0UL,_cellj_***,_false>.
                                                  _M_head_impl)[uVar34]->jx + uVar33));
          auVar55._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar52._8_8_;
          auVar55._0_8_ = (ulong)(bVar25 & 1) * auVar52._0_8_;
          auVar55._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar52._16_8_;
          auVar55._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar52._24_8_;
          auVar55._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar52._32_8_;
          auVar55._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar52._40_8_;
          auVar55._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar52._48_8_;
          auVar55._56_8_ = (uVar27 >> 7) * auVar52._56_8_;
          auVar51 = vfnmadd213pd_avx512f(auVar55,auVar42,auVar51);
          auVar52 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar18->ex + uVar33));
          auVar56._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar52._8_8_;
          auVar56._0_8_ = (ulong)(bVar25 & 1) * auVar52._0_8_;
          auVar56._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar52._16_8_;
          auVar56._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar52._24_8_;
          auVar56._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar52._32_8_;
          auVar56._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar52._40_8_;
          auVar56._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar52._48_8_;
          auVar56._56_8_ = (uVar27 >> 7) * auVar52._56_8_;
          auVar51 = vaddpd_avx512f(auVar51,auVar56);
          vscatterqpd_avx512f(ZEXT864(pcVar18) + auVar50,uVar27,auVar51);
          uVar32 = uVar32 + 8;
          auVar49 = vpaddq_avx512f(auVar49,auVar47);
        } while (((ulong)(iVar12 - 1) + 6 & 0x1fffffff8) != uVar32);
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 != uVar33);
  }
  if (2 < iVar10) {
    auVar76._8_8_ = 0;
    auVar76._0_8_ = (this->super_maxwell_solver).dtdx;
    auVar29._8_8_ = 0x8000000000000000;
    auVar29._0_8_ = 0x8000000000000000;
    auVar35 = vxorpd_avx512vl(auVar76,auVar29);
    auVar40 = vpbroadcastq_avx512f();
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (this->super_maxwell_solver).dtdz;
    auVar41 = vbroadcastsd_avx512f(auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (this->super_maxwell_solver).dy;
    auVar42 = vbroadcastsd_avx512f(auVar8);
    auVar43 = vbroadcastsd_avx512f(auVar35);
    uVar34 = 1;
    auVar44 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar45 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar46 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar47 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      if (2 < iVar12) {
        pppcVar19 = (((this->super_maxwell_solver).cb)->p)._M_t.
                    super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                    super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
        auVar48 = vpbroadcastq_avx512f();
        auVar49 = vpbroadcastq_avx512f();
        uVar32 = 0;
        auVar50 = vmovdqa64_avx512f(auVar44);
        do {
          auVar51 = vpbroadcastq_avx512f();
          auVar51 = vporq_avx512f(auVar51,auVar45);
          uVar27 = vpcmpuq_avx512f(auVar51,auVar40,2);
          auVar51 = vpmullq_avx512dq(auVar50,auVar46);
          vpaddq_avx512f(auVar48,auVar51);
          auVar52 = vgatherqpd_avx512f(*(undefined8 *)(uVar32 + 0x10));
          bVar25 = (byte)uVar27;
          auVar57._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar52._8_8_;
          auVar57._0_8_ = (ulong)(bVar25 & 1) * auVar52._0_8_;
          auVar57._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar52._16_8_;
          auVar57._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar52._24_8_;
          auVar57._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar52._32_8_;
          auVar57._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar52._40_8_;
          auVar57._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar52._48_8_;
          auVar57._56_8_ = (uVar27 >> 7) * auVar52._56_8_;
          auVar52 = vgatherqpd_avx512f(*(undefined8 *)((long)&(*pppcVar19[uVar34 - 1])->bz + uVar34)
                                      );
          auVar58._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar52._8_8_;
          auVar58._0_8_ = (ulong)(bVar25 & 1) * auVar52._0_8_;
          auVar58._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar52._16_8_;
          auVar58._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar52._24_8_;
          auVar58._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar52._32_8_;
          auVar58._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar52._40_8_;
          auVar58._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar52._48_8_;
          auVar58._56_8_ = (uVar27 >> 7) * auVar52._56_8_;
          auVar52 = vsubpd_avx512f(auVar57,auVar58);
          auVar53 = vgatherqpd_avx512f(*(undefined8 *)((long)&(*pppcVar19[uVar34])->bx + uVar34));
          auVar71._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar53._8_8_;
          auVar71._0_8_ = (ulong)(bVar25 & 1) * auVar53._0_8_;
          auVar71._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar53._16_8_;
          auVar71._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar53._24_8_;
          auVar71._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar53._32_8_;
          auVar71._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar53._40_8_;
          auVar71._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar53._48_8_;
          auVar71._56_8_ = (uVar27 >> 7) * auVar53._56_8_;
          auVar53 = vgatherqpd_avx512f(*(undefined8 *)(uVar32 - 0x18));
          auVar72._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar53._8_8_;
          auVar72._0_8_ = (ulong)(bVar25 & 1) * auVar53._0_8_;
          auVar72._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar53._16_8_;
          auVar72._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar53._24_8_;
          auVar72._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar53._32_8_;
          auVar72._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar53._40_8_;
          auVar72._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar53._48_8_;
          auVar72._56_8_ = (uVar27 >> 7) * auVar53._56_8_;
          auVar53 = vsubpd_avx512f(auVar71,auVar72);
          auVar53 = vmulpd_avx512f(auVar41,auVar53);
          auVar52 = vfmadd231pd_avx512f(auVar53,auVar43,auVar52);
          auVar53 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&(*(((this->super_maxwell_solver).cj)->p)._M_t.
                                                  super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>
                                                  .super__Head_base<0UL,_cellj_***,_false>.
                                                  _M_head_impl[uVar34])->jy + uVar34));
          auVar73._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar53._8_8_;
          auVar73._0_8_ = (ulong)(bVar25 & 1) * auVar53._0_8_;
          auVar73._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar53._16_8_;
          auVar73._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar53._24_8_;
          auVar73._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar53._32_8_;
          auVar73._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar53._40_8_;
          auVar73._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar53._48_8_;
          auVar73._56_8_ = (uVar27 >> 7) * auVar53._56_8_;
          auVar52 = vfnmadd213pd_avx512f(auVar73,auVar42,auVar52);
          auVar51 = vpaddq_avx512f(auVar49,auVar51);
          auVar53 = vgatherqpd_avx512f(*(undefined8 *)(uVar34 + 8));
          auVar74._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar53._8_8_;
          auVar74._0_8_ = (ulong)(bVar25 & 1) * auVar53._0_8_;
          auVar74._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar53._16_8_;
          auVar74._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar53._24_8_;
          auVar74._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar53._32_8_;
          auVar74._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar53._40_8_;
          auVar74._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar53._48_8_;
          auVar74._56_8_ = (uVar27 >> 7) * auVar53._56_8_;
          auVar52 = vaddpd_avx512f(auVar52,auVar74);
          vscatterqpd_avx512f(ZEXT864(8) + auVar51,uVar27,auVar52);
          uVar32 = uVar32 + 8;
          auVar50 = vpaddq_avx512f(auVar50,auVar47);
        } while (((ulong)(iVar12 - 1) + 6 & 0x1fffffff8) != uVar32);
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 != uVar31);
  }
  if (2 < iVar10) {
    auVar77._8_8_ = 0;
    auVar77._0_8_ = (this->super_maxwell_solver).dtdx;
    pfVar20 = (this->super_maxwell_solver).cb;
    pfVar21 = (this->super_maxwell_solver).cj;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = (this->super_maxwell_solver).dtdy;
    auVar30._8_8_ = 0x8000000000000000;
    auVar30._0_8_ = 0x8000000000000000;
    auVar35 = vxorpd_avx512vl(auVar78,auVar30);
    auVar79._8_8_ = 0;
    auVar79._0_8_ = (this->super_maxwell_solver).dz;
    uVar34 = 1;
    do {
      if (2 < (int)uVar11) {
        pppcVar19 = (pfVar20->p)._M_t.
                    super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                    super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
        ppcVar14 = pppcVar19[uVar34 - 1];
        ppcVar22 = pppcVar19[uVar34];
        ppcVar23 = (pfVar21->p)._M_t.
                   super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                   super__Head_base<0UL,_cellj_***,_false>._M_head_impl[uVar34];
        ppcVar24 = (pfVar13->p)._M_t.
                   super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                   super__Head_base<0UL,_celle_***,_false>._M_head_impl[uVar34];
        uVar32 = 1;
        do {
          pcVar15 = ppcVar22[uVar32];
          auVar80._8_8_ = 0;
          auVar80._0_8_ = (pcVar15->bx - ppcVar22[uVar32 - 1]->bx) * auVar35._0_8_;
          auVar81._8_8_ = 0;
          auVar81._0_8_ = pcVar15->by - ppcVar14[uVar32]->by;
          auVar36 = vfmadd231sd_fma(auVar80,auVar77,auVar81);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = ppcVar23[uVar32]->jz;
          auVar36 = vfnmadd231sd_fma(auVar36,auVar79,auVar9);
          pcVar18 = ppcVar24[uVar32];
          pcVar18->ez = auVar36._0_8_ + pcVar18->ez;
          uVar32 = uVar32 + 1;
        } while (uVar33 != uVar32);
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 != uVar31);
  }
  return;
}

Assistant:

void fdtd_solver::advance_e()
{
    const int nx = ce.get_nx();
    const int ny = ce.get_ny();
    const int nz = ce.get_nz();

    for(int i=1;i<nx-1;i++) {
        for(int j=1;j<ny-1;j++) {
            for(int k=1;k<nz-1;k++) {
                ce[i][j][k].ex +=  dtdy*(cb[i][j][k].bz-cb[i][j-1][k].bz) - dtdz*(cb[i][j][k].by-cb[i][j][k-1].by) - cj[i][j][k].jx*dx;
                ce[i][j][k].ey += -dtdx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + dtdz*(cb[i][j][k].bx-cb[i][j][k-1].bx) - cj[i][j][k].jy*dy;
                ce[i][j][k].ez +=  dtdx*(cb[i][j][k].by-cb[i-1][j][k].by) - dtdy*(cb[i][j][k].bx-cb[i][j-1][k].bx) - cj[i][j][k].jz*dz;
            }
        }
    }
    {int i=0;
        for(int j=1;j<ny-1;j++) {
            for(int k=1;k<nz-1;k++) {
                ce[i][j][k].ex +=  dtdy*(cb[i][j][k].bz-cb[i][j-1][k].bz) - dtdz*(cb[i][j][k].by-cb[i][j][k-1].by) - cj[i][j][k].jx*dx;
            }
        }
    }
    for(int i=1;i<nx-1;i++) {
        {int j=0;
            for(int k=1;k<nz-1;k++) {
                ce[i][j][k].ey += -dtdx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + dtdz*(cb[i][j][k].bx-cb[i][j][k-1].bx) - cj[i][j][k].jy*dy;
            }
        }
    }
    for(int i=1;i<nx-1;i++) {
        for(int j=1;j<ny-1;j++) {
            {int k=0;
                ce[i][j][k].ez +=  dtdx*(cb[i][j][k].by-cb[i-1][j][k].by) - dtdy*(cb[i][j][k].bx-cb[i][j-1][k].bx) - cj[i][j][k].jz*dz;
            }
        }
    }
}